

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall wallet::CWallet::Unlock(CWallet *this,SecureString *strWalletPassphrase)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  byte bVar4;
  long in_FS_OFFSET;
  span<const_unsigned_char,_18446744073709551615UL> ciphertext;
  span<const_unsigned_char,_18446744073709551615UL> salt;
  CKeyingMaterial _vMasterKey;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  CCrypter crypter;
  _Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> local_98;
  unique_lock<std::recursive_mutex> local_80;
  CCrypter local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CCrypter::CCrypter(&local_70);
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_80,&this->cs_wallet,
             "cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
             ,0x243,false);
  p_Var1 = &(this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var3 = (this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    salt._M_extent._M_extent_value = (long)p_Var3[2]._M_parent - (long)*(pointer *)(p_Var3 + 2);
    salt._M_ptr = *(pointer *)(p_Var3 + 2);
    bVar2 = CCrypter::SetKeyFromPassphrase
                      (&local_70,strWalletPassphrase,salt,*(uint *)((long)&p_Var3[2]._M_right + 4),
                       *(uint *)&p_Var3[2]._M_right);
    if (!bVar2) break;
    ciphertext._M_extent._M_extent_value = (long)p_Var3[1]._M_left - (long)p_Var3[1]._M_parent;
    ciphertext._M_ptr = (pointer)p_Var3[1]._M_parent;
    bVar2 = CCrypter::Decrypt(&local_70,ciphertext,(CKeyingMaterial *)&local_98);
    if (bVar2) {
      bVar2 = Unlock(this,(CKeyingMaterial *)&local_98);
      if (bVar2) {
        UpgradeKeyMetadata(this);
        bVar4 = 1;
        UpgradeDescriptorCache(this);
        goto LAB_0098fdab;
      }
    }
  }
  bVar4 = 0;
LAB_0098fdab:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_80);
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base(&local_98);
  CCrypter::~CCrypter(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)((_Rb_tree_header *)p_Var3 != p_Var1 & bVar4);
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::Unlock(const SecureString& strWalletPassphrase)
{
    CCrypter crypter;
    CKeyingMaterial _vMasterKey;

    {
        LOCK(cs_wallet);
        for (const MasterKeyMap::value_type& pMasterKey : mapMasterKeys)
        {
            if(!crypter.SetKeyFromPassphrase(strWalletPassphrase, pMasterKey.second.vchSalt, pMasterKey.second.nDeriveIterations, pMasterKey.second.nDerivationMethod))
                return false;
            if (!crypter.Decrypt(pMasterKey.second.vchCryptedKey, _vMasterKey))
                continue; // try another master key
            if (Unlock(_vMasterKey)) {
                // Now that we've unlocked, upgrade the key metadata
                UpgradeKeyMetadata();
                // Now that we've unlocked, upgrade the descriptor cache
                UpgradeDescriptorCache();
                return true;
            }
        }
    }
    return false;
}